

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::Printf<std::__cxx11::string,int&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               int *args_1)

{
  char *__s;
  string s;
  int *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  StringPrintf<std::__cxx11::string,int&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __s = (char *)std::__cxx11::string::c_str();
  fputs(__s,_stdout);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}